

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

void pdf_dict_putl(hd_context *ctx,pdf_obj *obj,pdf_obj *val,...)

{
  hd_error_stack_slot *phVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list keys;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &keys[0].overflow_arg_area;
  local_e8.gp_offset = 0x18;
  local_e8.fp_offset = 0x30;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      pdf_dict_vputl(ctx,obj,val,&local_e8);
    }
  }
  phVar1 = ctx->error->top;
  if (phVar1->code < 3) {
    phVar1->code = phVar1->code + 1;
    phVar1 = ctx->error->top;
    iVar2 = phVar1->code;
    ctx->error->top = phVar1 + -1;
    if (iVar2 < 2) {
      return;
    }
  }
  else {
    ctx->error->top = phVar1 + -1;
  }
  hd_rethrow(ctx);
}

Assistant:

void
pdf_dict_putl(hd_context *ctx, pdf_obj *obj, pdf_obj *val, ...)
{
    va_list keys;
    va_start(keys, val);

    hd_try(ctx)
    pdf_dict_vputl(ctx, obj, val, keys);
    hd_always(ctx)
            va_end(keys);
    hd_catch(ctx)
    hd_rethrow(ctx);
}